

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

Result host_rewind_to_ticks(Host *host,Ticks ticks)

{
  Result RVar1;
  Emulator *e_00;
  Ticks TVar2;
  JoypadCallbackInfo JVar3;
  JoypadCallback local_40;
  JoypadCallbackInfo old_jci;
  Emulator *e;
  RewindResult *result;
  Ticks ticks_local;
  Host *host_local;
  
  if ((host->rewind_state).rewinding == FALSE) {
    __assert_fail("host->rewind_state.rewinding",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",
                  0x179,"Result host_rewind_to_ticks(Host *, Ticks)");
  }
  RVar1 = rewind_to_ticks(host->rewind_buffer,ticks,&(host->rewind_state).rewind_result);
  if (RVar1 == OK) {
    e_00 = host_get_emulator(host);
    RVar1 = emulator_read_state(e_00,&(host->rewind_state).rewind_result.file_data);
    if (RVar1 == OK) {
      TVar2 = emulator_get_ticks(e_00);
      if (TVar2 == ((host->rewind_state).rewind_result.info)->ticks) {
        TVar2 = emulator_get_ticks(e_00);
        if (TVar2 < ticks) {
          JVar3 = emulator_get_joypad_callback(e_00);
          emulator_set_joypad_playback_callback
                    (e_00,host->joypad_buffer,&(host->rewind_state).joypad_playback);
          host_run_until_ticks(host,ticks);
          local_40 = JVar3.callback;
          old_jci.callback = (JoypadCallback)JVar3.user_data;
          emulator_set_joypad_callback(e_00,local_40,old_jci.callback);
        }
        return OK;
      }
      __assert_fail("emulator_get_ticks(e) == result->info->ticks",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",
                    0x180,"Result host_rewind_to_ticks(Host *, Ticks)");
    }
  }
  return ERROR;
}

Assistant:

Result host_rewind_to_ticks(Host* host, Ticks ticks) {
  assert(host->rewind_state.rewinding);

  RewindResult* result = &host->rewind_state.rewind_result;
  CHECK(SUCCESS(rewind_to_ticks(host->rewind_buffer, ticks, result)));

  Emulator* e = host_get_emulator(host);
  CHECK(SUCCESS(emulator_read_state(e, &result->file_data)));
  assert(emulator_get_ticks(e) == result->info->ticks);

  if (emulator_get_ticks(e) < ticks) {
    /* Save old joypad callback. */
    JoypadCallbackInfo old_jci = emulator_get_joypad_callback(e);
    emulator_set_joypad_playback_callback(e, host->joypad_buffer,
                                          &host->rewind_state.joypad_playback);
    host_run_until_ticks(host, ticks);
    /* Restore old joypad callback. */
    emulator_set_joypad_callback(e, old_jci.callback, old_jci.user_data);
  }

  return OK;
  ON_ERROR_RETURN;
}